

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enc_sse2.c
# Opt level: O0

void FTransformWHTRow_SSE2(int16_t *in,__m128i *out)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 (*in_RSI) [16];
  undefined8 *in_RDI;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  __m128i src2;
  __m128i src1;
  __m128i src0;
  __m128i kMult;
  undefined2 local_e8;
  undefined2 uStack_e6;
  undefined2 uStack_e4;
  undefined2 uStack_e2;
  undefined2 local_d8;
  undefined2 uStack_d6;
  undefined2 uStack_d4;
  undefined2 uStack_d2;
  undefined2 local_c8;
  undefined2 uStack_c6;
  undefined2 uStack_c4;
  undefined2 uStack_c2;
  undefined2 local_b8;
  undefined2 uStack_b6;
  undefined2 uStack_b4;
  undefined2 uStack_b2;
  undefined4 uStack_88;
  __m128i D;
  __m128i C1;
  __m128i C0;
  __m128i B1;
  __m128i B0;
  __m128i A23;
  __m128i A01;
  __m128i src3;
  
  uVar1 = *in_RDI;
  uVar2 = in_RDI[4];
  uVar3 = in_RDI[8];
  uVar4 = in_RDI[0xc];
  local_b8 = (undefined2)uVar1;
  uStack_b6 = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_b4 = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_b2 = (undefined2)((ulong)uVar1 >> 0x30);
  local_c8 = (undefined2)uVar2;
  uStack_c6 = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_c4 = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_c2 = (undefined2)((ulong)uVar2 >> 0x30);
  local_d8 = (undefined2)uVar3;
  uStack_d6 = (undefined2)((ulong)uVar3 >> 0x10);
  uStack_d4 = (undefined2)((ulong)uVar3 >> 0x20);
  uStack_d2 = (undefined2)((ulong)uVar3 >> 0x30);
  local_e8 = (undefined2)uVar4;
  uStack_e6 = (undefined2)((ulong)uVar4 >> 0x10);
  uStack_e4 = (undefined2)((ulong)uVar4 >> 0x20);
  uStack_e2 = (undefined2)((ulong)uVar4 >> 0x30);
  auVar6._2_2_ = local_c8;
  auVar6._0_2_ = local_b8;
  auVar6._4_2_ = uStack_b6;
  auVar6._6_2_ = uStack_c6;
  auVar6._10_2_ = uStack_c4;
  auVar6._8_2_ = uStack_b4;
  auVar6._12_2_ = uStack_b2;
  auVar6._14_2_ = uStack_c2;
  auVar5._2_2_ = local_e8;
  auVar5._0_2_ = local_d8;
  auVar5._4_2_ = uStack_d6;
  auVar5._6_2_ = uStack_e6;
  auVar5._10_2_ = uStack_e4;
  auVar5._8_2_ = uStack_d4;
  auVar5._12_2_ = uStack_d2;
  auVar5._14_2_ = uStack_e2;
  auVar9 = paddsw(auVar6,auVar5);
  auVar8._2_2_ = local_c8;
  auVar8._0_2_ = local_b8;
  auVar8._4_2_ = uStack_b6;
  auVar8._6_2_ = uStack_c6;
  auVar8._10_2_ = uStack_c4;
  auVar8._8_2_ = uStack_b4;
  auVar8._12_2_ = uStack_b2;
  auVar8._14_2_ = uStack_c2;
  auVar7._2_2_ = local_e8;
  auVar7._0_2_ = local_d8;
  auVar7._4_2_ = uStack_d6;
  auVar7._6_2_ = uStack_e6;
  auVar7._10_2_ = uStack_e4;
  auVar7._8_2_ = uStack_d4;
  auVar7._12_2_ = uStack_d2;
  auVar7._14_2_ = uStack_e2;
  auVar10 = psubsw(auVar8,auVar7);
  D[1]._0_4_ = auVar9._0_4_;
  uStack_88 = auVar10._0_4_;
  auVar10._4_4_ = uStack_88;
  auVar10._0_4_ = (undefined4)D[1];
  auVar10._12_4_ = (undefined4)D[1];
  auVar10._8_4_ = uStack_88;
  auVar9._8_8_ = 0xffff0001ffff0001;
  auVar9._0_8_ = 0x1000100010001;
  auVar9 = pmaddwd(auVar10,auVar9);
  *in_RSI = auVar9;
  return;
}

Assistant:

static void FTransformWHTRow_SSE2(const int16_t* const in, __m128i* const out) {
  const __m128i kMult = _mm_set_epi16(-1, 1, -1, 1, 1, 1, 1, 1);
  const __m128i src0 = _mm_loadl_epi64((__m128i*)&in[0 * 16]);
  const __m128i src1 = _mm_loadl_epi64((__m128i*)&in[1 * 16]);
  const __m128i src2 = _mm_loadl_epi64((__m128i*)&in[2 * 16]);
  const __m128i src3 = _mm_loadl_epi64((__m128i*)&in[3 * 16]);
  const __m128i A01 = _mm_unpacklo_epi16(src0, src1);  // A0 A1 | ...
  const __m128i A23 = _mm_unpacklo_epi16(src2, src3);  // A2 A3 | ...
  const __m128i B0 = _mm_adds_epi16(A01, A23);    // a0 | a1 | ...
  const __m128i B1 = _mm_subs_epi16(A01, A23);    // a3 | a2 | ...
  const __m128i C0 = _mm_unpacklo_epi32(B0, B1);  // a0 | a1 | a3 | a2 | ...
  const __m128i C1 = _mm_unpacklo_epi32(B1, B0);  // a3 | a2 | a0 | a1 | ...
  const __m128i D = _mm_unpacklo_epi64(C0, C1);   // a0 a1 a3 a2 a3 a2 a0 a1
  *out = _mm_madd_epi16(D, kMult);
}